

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_utf8.c
# Opt level: O0

int UTF8_putc(uchar *str,int len,ulong value)

{
  byte bVar1;
  int iVar2;
  int local_14;
  int local_4;
  
  if (str == (uchar *)0x0) {
    local_14 = 4;
  }
  else {
    local_14 = len;
    if (len < 1) {
      return -1;
    }
  }
  bVar1 = (byte)value;
  if (value < 0x80) {
    if (str != (uchar *)0x0) {
      *str = bVar1;
    }
    local_4 = 1;
  }
  else if (value < 0x800) {
    if (local_14 < 2) {
      local_4 = -1;
    }
    else {
      if (str != (uchar *)0x0) {
        *str = (byte)(value >> 6) & 0x1f | 0xc0;
        str[1] = bVar1 & 0x3f | 0x80;
      }
      local_4 = 2;
    }
  }
  else if (value < 0x10000) {
    iVar2 = is_unicode_surrogate(value);
    if (iVar2 == 0) {
      if (local_14 < 3) {
        local_4 = -1;
      }
      else {
        if (str != (uchar *)0x0) {
          *str = (byte)(value >> 0xc) & 0xf | 0xe0;
          str[1] = (byte)(value >> 6) & 0x3f | 0x80;
          str[2] = bVar1 & 0x3f | 0x80;
        }
        local_4 = 3;
      }
    }
    else {
      local_4 = -2;
    }
  }
  else if (value < 0x110000) {
    if (local_14 < 4) {
      local_4 = -1;
    }
    else {
      if (str != (uchar *)0x0) {
        *str = (byte)(value >> 0x12) & 7 | 0xf0;
        str[1] = (byte)(value >> 0xc) & 0x3f | 0x80;
        str[2] = (byte)(value >> 6) & 0x3f | 0x80;
        str[3] = bVar1 & 0x3f | 0x80;
      }
      local_4 = 4;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int UTF8_putc(unsigned char *str, int len, unsigned long value)
{
    if (!str)
        len = 4;                /* Maximum we will need */
    else if (len <= 0)
        return -1;
    if (value < 0x80) {
        if (str)
            *str = (unsigned char)value;
        return 1;
    }
    if (value < 0x800) {
        if (len < 2)
            return -1;
        if (str) {
            *str++ = (unsigned char)(((value >> 6) & 0x1f) | 0xc0);
            *str = (unsigned char)((value & 0x3f) | 0x80);
        }
        return 2;
    }
    if (value < 0x10000) {
        if (is_unicode_surrogate(value))
            return -2;
        if (len < 3)
            return -1;
        if (str) {
            *str++ = (unsigned char)(((value >> 12) & 0xf) | 0xe0);
            *str++ = (unsigned char)(((value >> 6) & 0x3f) | 0x80);
            *str = (unsigned char)((value & 0x3f) | 0x80);
        }
        return 3;
    }
    if (value < UNICODE_LIMIT) {
        if (len < 4)
            return -1;
        if (str) {
            *str++ = (unsigned char)(((value >> 18) & 0x7) | 0xf0);
            *str++ = (unsigned char)(((value >> 12) & 0x3f) | 0x80);
            *str++ = (unsigned char)(((value >> 6) & 0x3f) | 0x80);
            *str = (unsigned char)((value & 0x3f) | 0x80);
        }
        return 4;
    }
    return -2;
}